

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastReduceMatrix(Gia_Man_t *pNew,Vec_Wec_t *vProds,Vec_Wec_t *vLevels,Vec_Int_t *vRes)

{
  Vec_Int_t *pVVar1;
  Vec_Wec_t *pNew_00;
  int nBits;
  int iVar2;
  int b;
  int c;
  int a;
  int b_00;
  int b_01;
  int *pAdd0;
  int *pAdd1;
  int nSize;
  int Level3;
  int Level2;
  int Level1;
  int Node3;
  int Node2;
  int Node1;
  int LevelC;
  int LevelS;
  int NodeC;
  int NodeS;
  int i;
  Vec_Int_t *vProd;
  Vec_Int_t *vLevel;
  Vec_Int_t *vRes_local;
  Vec_Wec_t *vLevels_local;
  Vec_Wec_t *vProds_local;
  Gia_Man_t *pNew_local;
  
  vLevel = vRes;
  vRes_local = (Vec_Int_t *)vLevels;
  vLevels_local = vProds;
  vProds_local = (Vec_Wec_t *)pNew;
  nBits = Vec_WecSize(vProds);
  iVar2 = Vec_WecSize((Vec_Wec_t *)vRes_local);
  if (nBits != iVar2) {
    __assert_fail("nSize == Vec_WecSize(vLevels)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0x27d,
                  "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)");
  }
  for (NodeC = 0; NodeC < nBits; NodeC = NodeC + 1) {
    while( true ) {
      _NodeS = Vec_WecEntry(vLevels_local,NodeC);
      iVar2 = Vec_IntSize(_NodeS);
      if (iVar2 < 3) break;
      iVar2 = Vec_IntPop(_NodeS);
      b = Vec_IntPop(_NodeS);
      c = Vec_IntPop(_NodeS);
      vProd = Vec_WecEntry((Vec_Wec_t *)vRes_local,NodeC);
      a = Vec_IntPop(vProd);
      b_00 = Vec_IntPop(vProd);
      b_01 = Vec_IntPop(vProd);
      Wlc_BlastFullAdder((Gia_Man_t *)vProds_local,iVar2,b,c,&LevelC,&LevelS);
      iVar2 = Abc_MaxInt(a,b_00);
      iVar2 = Abc_MaxInt(iVar2,b_01);
      Wlc_IntInsert(_NodeS,vProd,LevelS,iVar2 + 2);
      _NodeS = Vec_WecEntry(vLevels_local,NodeC + 1);
      vProd = Vec_WecEntry((Vec_Wec_t *)vRes_local,NodeC + 1);
      Wlc_IntInsert(_NodeS,vProd,LevelC,iVar2 + 1);
    }
  }
  NodeC = 0;
  while( true ) {
    if (nBits <= NodeC) {
      vProd = Vec_WecEntry((Vec_Wec_t *)vRes_local,0);
      Vec_IntClear(vLevel);
      Vec_IntClear(vProd);
      for (NodeC = 0; pNew_00 = vProds_local, NodeC < nBits; NodeC = NodeC + 1) {
        _NodeS = Vec_WecEntry(vLevels_local,NodeC);
        pVVar1 = vLevel;
        iVar2 = Vec_IntEntry(_NodeS,0);
        Vec_IntPush(pVVar1,iVar2);
        pVVar1 = vProd;
        iVar2 = Vec_IntEntry(_NodeS,1);
        Vec_IntPush(pVVar1,iVar2);
      }
      pAdd0 = Vec_IntArray(vLevel);
      pAdd1 = Vec_IntArray(vProd);
      Wlc_BlastAdder((Gia_Man_t *)pNew_00,pAdd0,pAdd1,nBits);
      return;
    }
    _NodeS = Vec_WecEntry(vLevels_local,NodeC);
    while (iVar2 = Vec_IntSize(_NodeS), iVar2 < 2) {
      Vec_IntPush(_NodeS,0);
    }
    iVar2 = Vec_IntSize(_NodeS);
    if (iVar2 != 2) break;
    NodeC = NodeC + 1;
  }
  __assert_fail("Vec_IntSize(vProd) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                ,0x2a3,
                "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)");
}

Assistant:

void Wlc_BlastReduceMatrix( Gia_Man_t * pNew, Vec_Wec_t * vProds, Vec_Wec_t * vLevels, Vec_Int_t * vRes )
{
    Vec_Int_t * vLevel, * vProd;
    int i, NodeS, NodeC, LevelS, LevelC, Node1, Node2, Node3, Level1, Level2, Level3;
    int nSize = Vec_WecSize(vProds);
    assert( nSize == Vec_WecSize(vLevels) );
    for ( i = 0; i < nSize; i++ )
    {
        while ( 1 )
        {
            vProd  = Vec_WecEntry( vProds, i );
            if ( Vec_IntSize(vProd) < 3 )
                break;

            Node1  = Vec_IntPop( vProd );
            Node2  = Vec_IntPop( vProd );
            Node3  = Vec_IntPop( vProd );

            vLevel = Vec_WecEntry( vLevels, i );

            Level1 = Vec_IntPop( vLevel );
            Level2 = Vec_IntPop( vLevel );
            Level3 = Vec_IntPop( vLevel );

            Wlc_BlastFullAdder( pNew, Node1, Node2, Node3, &NodeC, &NodeS );
            LevelS = Abc_MaxInt( Abc_MaxInt(Level1, Level2), Level3 ) + 2;
            LevelC = LevelS - 1;

            Wlc_IntInsert( vProd, vLevel, NodeS, LevelS );

            vProd  = Vec_WecEntry( vProds, i+1 );
            vLevel = Vec_WecEntry( vLevels, i+1 );

            Wlc_IntInsert( vProd, vLevel, NodeC, LevelC );
        }
    }

    // make all ranks have two products
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        while ( Vec_IntSize(vProd) < 2 )
            Vec_IntPush( vProd, 0 );
        assert( Vec_IntSize(vProd) == 2 );
    }

    vLevel = Vec_WecEntry( vLevels, 0 );
    Vec_IntClear( vRes );
    Vec_IntClear( vLevel );
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        Vec_IntPush( vRes,   Vec_IntEntry(vProd, 0) );
        Vec_IntPush( vLevel, Vec_IntEntry(vProd, 1) );
    }
    Wlc_BlastAdder( pNew, Vec_IntArray(vRes), Vec_IntArray(vLevel), nSize );
}